

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pbVar4;
  char *__path;
  int *piVar5;
  long in_RSI;
  int in_EDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  int rv;
  iterator i_1;
  iterator i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  suites;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  bool helpMode;
  string tempDir;
  string *in_stack_000073a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd488;
  string *in_stack_ffffffffffffd490;
  string *in_stack_ffffffffffffd4a0;
  value_type *in_stack_ffffffffffffd4a8;
  string *in_stack_ffffffffffffd4b0;
  allocator<char> *in_stack_ffffffffffffd4c0;
  char *in_stack_ffffffffffffd4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd4d0;
  string *in_stack_ffffffffffffd540;
  string *in_stack_ffffffffffffd5a0;
  string *in_stack_ffffffffffffd5e0;
  undefined7 in_stack_ffffffffffffd5f0;
  undefined1 in_stack_ffffffffffffd5f7;
  string *in_stack_ffffffffffffd600;
  string *in_stack_ffffffffffffd640;
  string *in_stack_ffffffffffffd680;
  string *in_stack_ffffffffffffd6d0;
  string *in_stack_ffffffffffffd6e0;
  string *in_stack_ffffffffffffd7a0;
  string *in_stack_ffffffffffffd880;
  undefined7 in_stack_ffffffffffffd8f0;
  undefined1 in_stack_ffffffffffffd8f7;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffda10;
  string *in_stack_ffffffffffffda40;
  string *in_stack_ffffffffffffda80;
  string *in_stack_ffffffffffffdb50;
  string *in_stack_ffffffffffffdc00;
  string *in_stack_ffffffffffffdc40;
  undefined7 in_stack_ffffffffffffe1b0;
  undefined1 in_stack_ffffffffffffe1b7;
  undefined7 in_stack_ffffffffffffe2b0;
  undefined1 in_stack_ffffffffffffe2b7;
  _Self local_1b98;
  _Self local_1b90;
  _Self local_1b88;
  _Self local_1b80;
  _Base_ptr local_1b78;
  undefined1 local_1b70;
  allocator<char> local_1b61;
  string local_1b60 [32];
  _Base_ptr local_1b40;
  undefined1 local_1b38;
  allocator<char> local_1b29;
  string local_1b28 [32];
  _Base_ptr local_1b08;
  undefined1 local_1b00;
  allocator<char> local_1af1;
  string local_1af0 [32];
  _Base_ptr local_1ad0;
  undefined1 local_1ac8;
  allocator<char> local_1ab9;
  string local_1ab8 [32];
  _Base_ptr local_1a98;
  undefined1 local_1a90;
  allocator<char> local_1a81;
  string local_1a80 [32];
  _Base_ptr local_1a60;
  undefined1 local_1a58;
  allocator<char> local_1a49;
  string local_1a48 [32];
  _Base_ptr local_1a28;
  undefined1 local_1a20;
  allocator<char> local_1a11;
  string local_1a10 [32];
  _Base_ptr local_19f0;
  undefined1 local_19e8;
  allocator<char> local_19d9;
  string local_19d8 [32];
  _Base_ptr local_19b8;
  undefined1 local_19b0;
  allocator<char> local_19a1;
  string local_19a0 [32];
  _Base_ptr local_1980;
  undefined1 local_1978;
  allocator<char> local_1969;
  string local_1968 [32];
  _Base_ptr local_1948;
  undefined1 local_1940;
  allocator<char> local_1931;
  string local_1930 [32];
  _Base_ptr local_1910;
  undefined1 local_1908;
  allocator<char> local_18f9;
  string local_18f8 [32];
  _Base_ptr local_18d8;
  undefined1 local_18d0;
  allocator<char> local_18c1;
  string local_18c0 [32];
  _Base_ptr local_18a0;
  undefined1 local_1898;
  allocator<char> local_1889;
  string local_1888 [32];
  _Base_ptr local_1868;
  undefined1 local_1860;
  allocator<char> local_1851;
  string local_1850 [32];
  _Base_ptr local_1830;
  undefined1 local_1828;
  allocator<char> local_1819;
  string local_1818 [32];
  _Base_ptr local_17f8;
  undefined1 local_17f0;
  allocator<char> local_17e1;
  string local_17e0 [32];
  _Base_ptr local_17c0;
  undefined1 local_17b8;
  allocator<char> local_17a9;
  string local_17a8 [32];
  _Base_ptr local_1788;
  undefined1 local_1780;
  allocator<char> local_1771;
  string local_1770 [32];
  _Base_ptr local_1750;
  undefined1 local_1748;
  allocator<char> local_1739;
  string local_1738 [32];
  _Base_ptr local_1718;
  undefined1 local_1710;
  allocator<char> local_1701;
  string local_1700 [32];
  _Base_ptr local_16e0;
  undefined1 local_16d8;
  allocator<char> local_16c9;
  string local_16c8 [32];
  _Base_ptr local_16a8;
  undefined1 local_16a0;
  allocator<char> local_1691;
  string local_1690 [32];
  _Base_ptr local_1670;
  undefined1 local_1668;
  allocator<char> local_1659;
  string local_1658 [32];
  _Base_ptr local_1638;
  undefined1 local_1630;
  allocator<char> local_1621;
  string local_1620 [32];
  _Base_ptr local_1600;
  undefined1 local_15f8;
  allocator<char> local_15e9;
  string local_15e8 [32];
  _Base_ptr local_15c8;
  undefined1 local_15c0;
  allocator<char> local_15b1;
  string local_15b0 [32];
  _Base_ptr local_1590;
  undefined1 local_1588;
  allocator<char> local_1579;
  string local_1578 [32];
  _Base_ptr local_1558;
  undefined1 local_1550;
  allocator<char> local_1541;
  string local_1540 [32];
  _Base_ptr local_1520;
  undefined1 local_1518;
  allocator<char> local_1509;
  string local_1508 [32];
  _Base_ptr local_14e8;
  undefined1 local_14e0;
  allocator<char> local_14d1;
  string local_14d0 [32];
  _Base_ptr local_14b0;
  undefined1 local_14a8;
  allocator<char> local_1499;
  string local_1498 [32];
  _Base_ptr local_1478;
  undefined1 local_1470;
  allocator<char> local_1461;
  string local_1460 [32];
  _Base_ptr local_1440;
  undefined1 local_1438;
  allocator<char> local_1429;
  string local_1428 [32];
  _Base_ptr local_1408;
  undefined1 local_1400;
  allocator<char> local_13f1;
  string local_13f0 [32];
  _Base_ptr local_13d0;
  undefined1 local_13c8;
  allocator<char> local_13b9;
  string local_13b8 [32];
  _Base_ptr local_1398;
  undefined1 local_1390;
  allocator<char> local_1381;
  string local_1380 [32];
  _Base_ptr local_1360;
  undefined1 local_1358;
  allocator<char> local_1349;
  string local_1348 [32];
  _Base_ptr local_1328;
  undefined1 local_1320;
  allocator<char> local_1311;
  string local_1310 [32];
  _Base_ptr local_12f0;
  undefined1 local_12e8;
  allocator<char> local_12d9;
  string local_12d8 [32];
  _Base_ptr local_12b8;
  undefined1 local_12b0;
  allocator<char> local_12a1;
  string local_12a0 [32];
  _Base_ptr local_1280;
  undefined1 local_1278;
  allocator<char> local_1269;
  string local_1268 [32];
  _Base_ptr local_1248;
  undefined1 local_1240;
  undefined1 local_1231 [33];
  _Base_ptr local_1210;
  undefined1 local_1208;
  allocator<char> local_11f9;
  string local_11f8 [32];
  _Base_ptr local_11d8;
  undefined1 local_11d0;
  allocator<char> local_11c1;
  string *in_stack_ffffffffffffee40;
  allocator<char> local_1189;
  string local_1188 [32];
  _Base_ptr local_1168;
  undefined1 local_1160;
  allocator<char> local_1151;
  string local_1150 [32];
  _Base_ptr local_1130;
  undefined1 local_1128;
  allocator<char> local_1119;
  string local_1118 [32];
  _Base_ptr local_10f8;
  undefined1 local_10f0;
  allocator<char> local_10e1;
  string local_10e0 [32];
  _Base_ptr local_10c0;
  undefined1 local_10b8;
  allocator<char> local_10a9;
  string local_10a8 [32];
  _Base_ptr local_1088;
  undefined1 local_1080;
  allocator<char> local_1071;
  string local_1070 [32];
  _Base_ptr local_1050;
  undefined1 local_1048;
  allocator<char> local_1039;
  string local_1038 [32];
  _Base_ptr local_1018;
  undefined1 local_1010;
  allocator<char> local_1001;
  string local_1000 [32];
  _Base_ptr local_fe0;
  undefined1 local_fd8;
  allocator<char> local_fc9;
  string local_fc8 [32];
  _Base_ptr local_fa8;
  undefined1 local_fa0;
  undefined1 local_f91 [33];
  _Base_ptr local_f70;
  undefined1 local_f68;
  allocator<char> local_f59;
  string local_f58 [32];
  _Base_ptr local_f38;
  undefined1 local_f30;
  allocator<char> local_f21;
  string local_f20 [32];
  _Base_ptr local_f00;
  undefined1 local_ef8;
  allocator<char> local_ee9;
  string local_ee8 [32];
  _Base_ptr local_ec8;
  undefined1 local_ec0;
  allocator<char> local_eb1;
  string local_eb0 [32];
  _Base_ptr local_e90;
  undefined1 local_e88;
  allocator<char> local_e79;
  string local_e78 [32];
  _Base_ptr local_e58;
  undefined1 local_e50;
  allocator<char> local_e41;
  string local_e40 [32];
  _Base_ptr local_e20;
  undefined1 local_e18;
  allocator<char> local_e09;
  string local_e08 [32];
  _Base_ptr local_de8;
  undefined1 local_de0;
  allocator<char> local_dd1;
  string local_dd0 [32];
  _Base_ptr local_db0;
  undefined1 local_da8;
  allocator<char> local_d99;
  string local_d98 [32];
  _Base_ptr local_d78;
  undefined1 local_d70;
  allocator<char> local_d61;
  string local_d60 [32];
  _Base_ptr local_d40;
  undefined1 local_d38;
  allocator<char> local_d29;
  string local_d28 [32];
  _Base_ptr local_d08;
  undefined1 local_d00;
  allocator<char> local_cf1;
  string local_cf0 [32];
  _Base_ptr local_cd0;
  undefined1 local_cc8;
  allocator<char> local_cb9;
  string local_cb8 [32];
  _Base_ptr local_c98;
  undefined1 local_c90;
  allocator<char> local_c81;
  string local_c80 [32];
  _Base_ptr local_c60;
  undefined1 local_c58;
  allocator<char> local_c49;
  string local_c48 [32];
  _Base_ptr local_c28;
  undefined1 local_c20;
  allocator<char> local_c11;
  string local_c10 [32];
  _Base_ptr local_bf0;
  undefined1 local_be8;
  allocator<char> local_bd9;
  string local_bd8 [32];
  _Base_ptr local_bb8;
  undefined1 local_bb0;
  allocator<char> local_ba1;
  string local_ba0 [32];
  _Base_ptr local_b80;
  undefined1 local_b78;
  allocator<char> local_b69;
  string local_b68 [32];
  _Base_ptr local_b48;
  undefined1 local_b40;
  allocator<char> local_b31;
  string local_b30 [32];
  _Base_ptr local_b10;
  undefined1 local_b08;
  allocator<char> local_af9;
  string local_af8 [32];
  _Base_ptr local_ad8;
  undefined1 local_ad0;
  allocator<char> local_ac1;
  string local_ac0 [32];
  _Base_ptr local_aa0;
  undefined1 local_a98;
  allocator<char> local_a89;
  string local_a88 [32];
  _Base_ptr local_a68;
  undefined1 local_a60;
  allocator<char> local_a51;
  string local_a50 [32];
  _Base_ptr local_a30;
  undefined1 local_a28;
  allocator<char> local_a19;
  string local_a18 [32];
  _Base_ptr local_9f8;
  undefined1 local_9f0;
  allocator<char> local_9e1;
  string local_9e0 [32];
  _Base_ptr local_9c0;
  undefined1 local_9b8;
  allocator<char> local_9a9;
  string local_9a8 [32];
  _Base_ptr local_988;
  undefined1 local_980;
  allocator<char> local_971;
  string local_970 [32];
  _Base_ptr local_950;
  undefined1 local_948;
  allocator<char> local_939;
  string local_938 [32];
  _Base_ptr local_918;
  undefined1 local_910;
  allocator<char> local_901;
  string local_900 [32];
  _Base_ptr local_8e0;
  undefined1 local_8d8;
  allocator<char> local_8c9;
  string local_8c8 [32];
  _Base_ptr local_8a8;
  undefined1 local_8a0;
  allocator<char> local_891;
  string local_890 [32];
  _Base_ptr local_870;
  undefined1 local_868;
  allocator<char> local_859;
  string local_858 [32];
  _Base_ptr local_838;
  undefined1 local_830;
  allocator<char> local_821;
  string local_820 [32];
  _Base_ptr local_800;
  undefined1 local_7f8;
  allocator<char> local_7e9;
  string local_7e8 [32];
  _Base_ptr local_7c8;
  undefined1 local_7c0;
  allocator<char> local_7b1;
  string local_7b0 [32];
  _Base_ptr local_790;
  undefined1 local_788;
  allocator<char> local_779;
  string local_778 [32];
  _Base_ptr local_758;
  undefined1 local_750;
  allocator<char> local_741;
  string local_740 [32];
  _Base_ptr local_720;
  undefined1 local_718;
  allocator<char> local_709;
  string local_708 [32];
  _Base_ptr local_6e8;
  undefined1 local_6e0;
  allocator<char> local_6d1;
  string local_6d0 [32];
  _Base_ptr local_6b0;
  undefined1 local_6a8;
  allocator<char> local_699;
  string local_698 [32];
  _Base_ptr local_678;
  undefined1 local_670;
  allocator<char> local_661;
  string local_660 [32];
  _Base_ptr local_640;
  undefined1 local_638;
  allocator<char> local_629;
  string local_628 [32];
  _Base_ptr local_608;
  undefined1 local_600;
  allocator<char> local_5f1;
  string local_5f0 [32];
  _Base_ptr local_5d0;
  undefined1 local_5c8;
  allocator<char> local_5b9;
  string local_5b8 [32];
  _Base_ptr local_598;
  undefined1 local_590;
  allocator<char> local_581;
  string local_580 [32];
  _Base_ptr local_560;
  undefined1 local_558;
  allocator<char> local_549;
  string local_548 [32];
  _Base_ptr local_528;
  undefined1 local_520;
  allocator<char> local_511;
  string local_510 [32];
  _Base_ptr local_4f0;
  undefined1 local_4e8;
  allocator<char> local_4d9;
  string local_4d8 [32];
  _Base_ptr local_4b8;
  undefined1 local_4b0;
  allocator<char> local_4a1;
  string local_4a0 [32];
  _Base_ptr local_480;
  undefined1 local_478;
  allocator<char> local_469;
  string local_468 [32];
  _Base_ptr local_448;
  undefined1 local_440;
  allocator<char> local_431;
  string local_430 [32];
  _Base_ptr local_410;
  undefined1 local_408;
  allocator<char> local_3f9;
  string local_3f8 [32];
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  allocator<char> local_3c1;
  string local_3c0 [32];
  _Base_ptr local_3a0;
  undefined1 local_398;
  allocator<char> local_389;
  string local_388 [32];
  _Base_ptr local_368;
  undefined1 local_360;
  allocator<char> local_351;
  string local_350 [32];
  _Base_ptr local_330;
  undefined1 local_328;
  allocator<char> local_319;
  string local_318 [32];
  _Base_ptr local_2f8;
  undefined1 local_2f0;
  allocator<char> local_2e1;
  string local_2e0 [32];
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  allocator<char> local_2a9;
  string local_2a8 [32];
  _Base_ptr local_288;
  undefined1 local_280;
  allocator<char> local_271;
  string local_270 [32];
  _Base_ptr local_250;
  undefined1 local_248;
  allocator<char> local_239;
  string local_238 [32];
  _Base_ptr local_218;
  undefined1 local_210;
  allocator<char> local_201;
  string local_200 [32];
  _Base_ptr local_1e0;
  undefined1 local_1d8;
  allocator<char> local_1c9;
  string local_1c8 [32];
  _Base_ptr local_1a8;
  undefined1 local_1a0;
  allocator<char> local_191;
  string local_190 [32];
  _Base_ptr local_170;
  undefined1 local_168;
  allocator<char> local_159;
  string local_158 [32];
  _Base_ptr local_138;
  undefined1 local_130;
  allocator<char> local_121;
  string local_120 [32];
  _Base_ptr local_100;
  undefined1 local_f8;
  allocator<char> local_e9;
  string local_e8 [48];
  string local_b8 [135];
  byte local_31;
  string local_30;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::__cxx11::string::string((string *)&local_30);
  local_31 = 0;
  if ((local_8 == 2) &&
     ((iVar2 = strcmp(*(char **)(local_10 + 8),"--help"), iVar2 == 0 ||
      (iVar2 = strcmp(*(char **)(local_10 + 8),"-h"), iVar2 == 0)))) {
    local_31 = 1;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x14facf);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x14fadc);
  if ((local_31 & 1) == 0) {
    makeTempDir_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&local_30,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testBase"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testBase");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testBase(in_stack_ffffffffffffd4a0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_100 = (_Base_ptr)pVar6.first._M_node;
    local_f8 = pVar6.second;
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_138 = (_Base_ptr)pVar6.first._M_node;
    local_130 = pVar6.second;
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testBaseErrors"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testBaseErrors");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testBaseErrors(in_stack_ffffffffffffd490);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_170 = (_Base_ptr)pVar6.first._M_node;
    local_168 = pVar6.second;
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator(&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1a8 = (_Base_ptr)pVar6.first._M_node;
    local_1a0 = pVar6.second;
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testBaseLimits"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testBaseLimits");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testBaseLimits(in_stack_ffffffffffffd490);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1e0 = (_Base_ptr)pVar6.first._M_node;
    local_1d8 = pVar6.second;
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_218 = (_Base_ptr)pVar6.first._M_node;
    local_210 = pVar6.second;
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator(&local_201);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testBaseDebug"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testBaseDebug");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testBaseDebug(in_stack_ffffffffffffd490);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_250 = (_Base_ptr)pVar6.first._M_node;
    local_248 = pVar6.second;
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator(&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_288 = (_Base_ptr)pVar6.first._M_node;
    local_280 = pVar6.second;
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator(&local_271);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testCPUIdent"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testCPUIdent");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testCPUIdent(in_stack_ffffffffffffd4a0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_2c0 = (_Base_ptr)pVar6.first._M_node;
    local_2b8 = pVar6.second;
    std::__cxx11::string::~string(local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_2f8 = (_Base_ptr)pVar6.first._M_node;
    local_2f0 = pVar6.second;
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testHalf"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testHalf");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testHalf((string *)0x1509c6);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_330 = (_Base_ptr)pVar6.first._M_node;
    local_328 = pVar6.second;
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator(&local_319);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_368 = (_Base_ptr)pVar6.first._M_node;
    local_360 = pVar6.second;
    std::__cxx11::string::~string(local_350);
    std::allocator<char>::~allocator(&local_351);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testXDR"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testXDR");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testXDR(in_stack_ffffffffffffd4d0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_3a0 = (_Base_ptr)pVar6.first._M_node;
    local_398 = pVar6.second;
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator(&local_389);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_3d8 = (_Base_ptr)pVar6.first._M_node;
    in_stack_ffffffffffffe2b7 = pVar6.second;
    local_3d0 = in_stack_ffffffffffffe2b7;
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testBufferCompression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testBufferCompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testBufferCompression(in_stack_ffffffffffffd600);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_410 = (_Base_ptr)pVar6.first._M_node;
    local_408 = pVar6.second;
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_448 = (_Base_ptr)pVar6.first._M_node;
    local_440 = pVar6.second;
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator(&local_431);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testTempContext"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testTempContext");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testTempContext(in_stack_ffffffffffffd540);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_480 = (_Base_ptr)pVar6.first._M_node;
    local_478 = pVar6.second;
    std::__cxx11::string::~string(local_468);
    std::allocator<char>::~allocator(&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_4b8 = (_Base_ptr)pVar6.first._M_node;
    local_4b0 = pVar6.second;
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testAttrSizes"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"gen_attr"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testAttrSizes");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testAttrSizes(&local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_4f0 = (_Base_ptr)pVar6.first._M_node;
    local_4e8 = pVar6.second;
    std::__cxx11::string::~string(local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_528 = (_Base_ptr)pVar6.first._M_node;
    local_520 = pVar6.second;
    std::__cxx11::string::~string(local_510);
    std::allocator<char>::~allocator(&local_511);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testAttrStrings"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"gen_attr"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testAttrStrings");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testAttrStrings(in_stack_ffffffffffffd490);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_560 = (_Base_ptr)pVar6.first._M_node;
    local_558 = pVar6.second;
    std::__cxx11::string::~string(local_548);
    std::allocator<char>::~allocator(&local_549);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_598 = (_Base_ptr)pVar6.first._M_node;
    in_stack_ffffffffffffe1b7 = pVar6.second;
    local_590 = in_stack_ffffffffffffe1b7;
    std::__cxx11::string::~string(local_580);
    std::allocator<char>::~allocator(&local_581);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testAttrStringVectors"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"gen_attr"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testAttrStringVectors");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testAttrStringVectors(in_stack_ffffffffffffd490);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_5d0 = (_Base_ptr)pVar6.first._M_node;
    local_5c8 = pVar6.second;
    std::__cxx11::string::~string(local_5b8);
    std::allocator<char>::~allocator(&local_5b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_608 = (_Base_ptr)pVar6.first._M_node;
    local_600 = pVar6.second;
    std::__cxx11::string::~string(local_5f0);
    std::allocator<char>::~allocator(&local_5f1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testAttrFloatVectors"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"gen_attr"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testAttrFloatVectors");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testAttrFloatVectors(in_stack_ffffffffffffd490);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_640 = (_Base_ptr)pVar6.first._M_node;
    local_638 = pVar6.second;
    std::__cxx11::string::~string(local_628);
    std::allocator<char>::~allocator(&local_629);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_678 = (_Base_ptr)pVar6.first._M_node;
    local_670 = pVar6.second;
    std::__cxx11::string::~string(local_660);
    std::allocator<char>::~allocator(&local_661);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testAttrChlists"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"gen_attr"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testAttrChlists");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testAttrChlists(in_stack_ffffffffffffd490);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_6b0 = (_Base_ptr)pVar6.first._M_node;
    local_6a8 = pVar6.second;
    std::__cxx11::string::~string(local_698);
    std::allocator<char>::~allocator(&local_699);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_6e8 = (_Base_ptr)pVar6.first._M_node;
    local_6e0 = pVar6.second;
    std::__cxx11::string::~string(local_6d0);
    std::allocator<char>::~allocator(&local_6d1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testAttrPreview"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"gen_attr"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testAttrPreview");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testAttrPreview(in_stack_ffffffffffffd490);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_720 = (_Base_ptr)pVar6.first._M_node;
    local_718 = pVar6.second;
    std::__cxx11::string::~string(local_708);
    std::allocator<char>::~allocator(&local_709);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_758 = (_Base_ptr)pVar6.first._M_node;
    local_750 = pVar6.second;
    std::__cxx11::string::~string(local_740);
    std::allocator<char>::~allocator(&local_741);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testAttrOpaque"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"gen_attr"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testAttrOpaque");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testAttrOpaque(in_stack_ffffffffffffd490);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_790 = (_Base_ptr)pVar6.first._M_node;
    local_788 = pVar6.second;
    std::__cxx11::string::~string(local_778);
    std::allocator<char>::~allocator(&local_779);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_7c8 = (_Base_ptr)pVar6.first._M_node;
    local_7c0 = pVar6.second;
    std::__cxx11::string::~string(local_7b0);
    std::allocator<char>::~allocator(&local_7b1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testAttrHandler"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"gen_attr"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testAttrHandler");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testAttrHandler(in_stack_ffffffffffffd6d0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_800 = (_Base_ptr)pVar6.first._M_node;
    local_7f8 = pVar6.second;
    std::__cxx11::string::~string(local_7e8);
    std::allocator<char>::~allocator(&local_7e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_838 = (_Base_ptr)pVar6.first._M_node;
    local_830 = pVar6.second;
    std::__cxx11::string::~string(local_820);
    std::allocator<char>::~allocator(&local_821);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testAttrLists"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"gen_attr"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testAttrLists");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testAttrLists(in_stack_ffffffffffffd490);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_870 = (_Base_ptr)pVar6.first._M_node;
    local_868 = pVar6.second;
    std::__cxx11::string::~string(local_858);
    std::allocator<char>::~allocator(&local_859);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_8a8 = (_Base_ptr)pVar6.first._M_node;
    local_8a0 = pVar6.second;
    std::__cxx11::string::~string(local_890);
    std::allocator<char>::~allocator(&local_891);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testReadBadArgs"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testReadBadArgs");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testReadBadArgs(in_stack_ffffffffffffd7a0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_8e0 = (_Base_ptr)pVar6.first._M_node;
    local_8d8 = pVar6.second;
    std::__cxx11::string::~string(local_8c8);
    std::allocator<char>::~allocator(&local_8c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_918 = (_Base_ptr)pVar6.first._M_node;
    local_910 = pVar6.second;
    std::__cxx11::string::~string(local_900);
    std::allocator<char>::~allocator(&local_901);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testReadBadFiles"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testReadBadFiles");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testReadBadFiles((string *)CONCAT17(in_stack_ffffffffffffd5f7,in_stack_ffffffffffffd5f0));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_950 = (_Base_ptr)pVar6.first._M_node;
    local_948 = pVar6.second;
    std::__cxx11::string::~string(local_938);
    std::allocator<char>::~allocator(&local_939);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_988 = (_Base_ptr)pVar6.first._M_node;
    local_980 = pVar6.second;
    std::__cxx11::string::~string(local_970);
    std::allocator<char>::~allocator(&local_971);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testReadMeta"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testReadMeta");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testReadMeta(in_stack_ffffffffffffdc40);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_9c0 = (_Base_ptr)pVar6.first._M_node;
    local_9b8 = pVar6.second;
    std::__cxx11::string::~string(local_9a8);
    std::allocator<char>::~allocator(&local_9a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_9f8 = (_Base_ptr)pVar6.first._M_node;
    local_9f0 = pVar6.second;
    std::__cxx11::string::~string(local_9e0);
    std::allocator<char>::~allocator(&local_9e1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testOpenScans"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testOpenScans");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testOpenScans(in_stack_ffffffffffffd5e0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_a30 = (_Base_ptr)pVar6.first._M_node;
    local_a28 = pVar6.second;
    std::__cxx11::string::~string(local_a18);
    std::allocator<char>::~allocator(&local_a19);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_a68 = (_Base_ptr)pVar6.first._M_node;
    local_a60 = pVar6.second;
    std::__cxx11::string::~string(local_a50);
    std::allocator<char>::~allocator(&local_a51);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testOpenTiles"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testOpenTiles");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testOpenTiles(in_stack_ffffffffffffd5a0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_aa0 = (_Base_ptr)pVar6.first._M_node;
    local_a98 = pVar6.second;
    std::__cxx11::string::~string(local_a88);
    std::allocator<char>::~allocator(&local_a89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_ad8 = (_Base_ptr)pVar6.first._M_node;
    local_ad0 = pVar6.second;
    std::__cxx11::string::~string(local_ac0);
    std::allocator<char>::~allocator(&local_ac1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testOpenMultiPart"), iVar2 == 0)
        ) || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testOpenMultiPart");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testOpenMultiPart(&local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_b10 = (_Base_ptr)pVar6.first._M_node;
    local_b08 = pVar6.second;
    std::__cxx11::string::~string(local_af8);
    std::allocator<char>::~allocator(&local_af9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_b48 = (_Base_ptr)pVar6.first._M_node;
    local_b40 = pVar6.second;
    std::__cxx11::string::~string(local_b30);
    std::allocator<char>::~allocator(&local_b31);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testOpenDeep"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testOpenDeep");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testOpenDeep((string *)CONCAT17(in_stack_ffffffffffffd5f7,in_stack_ffffffffffffd5f0));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_b80 = (_Base_ptr)pVar6.first._M_node;
    local_b78 = pVar6.second;
    std::__cxx11::string::~string(local_b68);
    std::allocator<char>::~allocator(&local_b69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_bb8 = (_Base_ptr)pVar6.first._M_node;
    local_bb0 = pVar6.second;
    std::__cxx11::string::~string(local_ba0);
    std::allocator<char>::~allocator(&local_ba1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testReadScans"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testReadScans");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testReadScans((string *)CONCAT17(in_stack_ffffffffffffe1b7,in_stack_ffffffffffffe1b0));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_bf0 = (_Base_ptr)pVar6.first._M_node;
    local_be8 = pVar6.second;
    std::__cxx11::string::~string(local_bd8);
    std::allocator<char>::~allocator(&local_bd9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_c28 = (_Base_ptr)pVar6.first._M_node;
    local_c20 = pVar6.second;
    std::__cxx11::string::~string(local_c10);
    std::allocator<char>::~allocator(&local_c11);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testReadTiles"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testReadTiles");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testReadTiles((string *)CONCAT17(in_stack_ffffffffffffe2b7,in_stack_ffffffffffffe2b0));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_c60 = (_Base_ptr)pVar6.first._M_node;
    local_c58 = pVar6.second;
    std::__cxx11::string::~string(local_c48);
    std::allocator<char>::~allocator(&local_c49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_c98 = (_Base_ptr)pVar6.first._M_node;
    local_c90 = pVar6.second;
    std::__cxx11::string::~string(local_c80);
    std::allocator<char>::~allocator(&local_c81);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testReadMultiPart"), iVar2 == 0)
        ) || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testReadMultiPart");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testReadMultiPart(&local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_cd0 = (_Base_ptr)pVar6.first._M_node;
    local_cc8 = pVar6.second;
    std::__cxx11::string::~string(local_cb8);
    std::allocator<char>::~allocator(&local_cb9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_d08 = (_Base_ptr)pVar6.first._M_node;
    local_d00 = pVar6.second;
    std::__cxx11::string::~string(local_cf0);
    std::allocator<char>::~allocator(&local_cf1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testReadDeep"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testReadDeep");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testReadDeep(in_stack_ffffffffffffd880);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_d40 = (_Base_ptr)pVar6.first._M_node;
    local_d38 = pVar6.second;
    std::__cxx11::string::~string(local_d28);
    std::allocator<char>::~allocator(&local_d29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_d78 = (_Base_ptr)pVar6.first._M_node;
    local_d70 = pVar6.second;
    std::__cxx11::string::~string(local_d60);
    std::allocator<char>::~allocator(&local_d61);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testReadUnpack"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_read"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testReadUnpack");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testReadUnpack((string *)CONCAT17(in_stack_ffffffffffffd8f7,in_stack_ffffffffffffd8f0));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_db0 = (_Base_ptr)pVar6.first._M_node;
    local_da8 = pVar6.second;
    std::__cxx11::string::~string(local_d98);
    std::allocator<char>::~allocator(&local_d99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_de8 = (_Base_ptr)pVar6.first._M_node;
    local_de0 = pVar6.second;
    std::__cxx11::string::~string(local_dd0);
    std::allocator<char>::~allocator(&local_dd1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testWriteBadArgs"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testWriteBadArgs");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testWriteBadArgs(in_stack_ffffffffffffd640);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_e20 = (_Base_ptr)pVar6.first._M_node;
    local_e18 = pVar6.second;
    std::__cxx11::string::~string(local_e08);
    std::allocator<char>::~allocator(&local_e09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_e58 = (_Base_ptr)pVar6.first._M_node;
    local_e50 = pVar6.second;
    std::__cxx11::string::~string(local_e40);
    std::allocator<char>::~allocator(&local_e41);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testWriteBadFiles"), iVar2 == 0)
        ) || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testWriteBadFiles");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testWriteBadFiles(&local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_e90 = (_Base_ptr)pVar6.first._M_node;
    local_e88 = pVar6.second;
    std::__cxx11::string::~string(local_e78);
    std::allocator<char>::~allocator(&local_e79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_ec8 = (_Base_ptr)pVar6.first._M_node;
    local_ec0 = pVar6.second;
    std::__cxx11::string::~string(local_eb0);
    std::allocator<char>::~allocator(&local_eb1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testUpdateMeta"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testUpdateMeta");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testUpdateMeta(&local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_f00 = (_Base_ptr)pVar6.first._M_node;
    local_ef8 = pVar6.second;
    std::__cxx11::string::~string(local_ee8);
    std::allocator<char>::~allocator(&local_ee9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_f38 = (_Base_ptr)pVar6.first._M_node;
    local_f30 = pVar6.second;
    std::__cxx11::string::~string(local_f20);
    std::allocator<char>::~allocator(&local_f21);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testWriteBaseHeader"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testWriteBaseHeader");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testWriteBaseHeader(in_stack_ffffffffffffee40);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_f70 = (_Base_ptr)pVar6.first._M_node;
    local_f68 = pVar6.second;
    std::__cxx11::string::~string(local_f58);
    std::allocator<char>::~allocator(&local_f59);
    in_stack_ffffffffffffdc00 = (string *)local_f91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_fa8 = (_Base_ptr)pVar6.first._M_node;
    local_fa0 = pVar6.second;
    std::__cxx11::string::~string((string *)(local_f91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f91);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testWriteAttrs"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testWriteAttrs");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testWriteAttrs(in_stack_000073a0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_fe0 = (_Base_ptr)pVar6.first._M_node;
    local_fd8 = pVar6.second;
    std::__cxx11::string::~string(local_fc8);
    std::allocator<char>::~allocator(&local_fc9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1018 = (_Base_ptr)pVar6.first._M_node;
    local_1010 = pVar6.second;
    std::__cxx11::string::~string(local_1000);
    std::allocator<char>::~allocator(&local_1001);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testStartWriteScan"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testStartWriteScan");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testStartWriteScan(in_stack_ffffffffffffdc00);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1050 = (_Base_ptr)pVar6.first._M_node;
    local_1048 = pVar6.second;
    std::__cxx11::string::~string(local_1038);
    std::allocator<char>::~allocator(&local_1039);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1088 = (_Base_ptr)pVar6.first._M_node;
    local_1080 = pVar6.second;
    std::__cxx11::string::~string(local_1070);
    std::allocator<char>::~allocator(&local_1071);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testStartWriteTile"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testStartWriteTile");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testStartWriteTile(in_stack_ffffffffffffdb50);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_10c0 = (_Base_ptr)pVar6.first._M_node;
    local_10b8 = pVar6.second;
    std::__cxx11::string::~string(local_10a8);
    std::allocator<char>::~allocator(&local_10a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_10f8 = (_Base_ptr)pVar6.first._M_node;
    local_10f0 = pVar6.second;
    std::__cxx11::string::~string(local_10e0);
    std::allocator<char>::~allocator(&local_10e1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testStartWriteDeepScan"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testStartWriteDeepScan");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testStartWriteDeepScan(in_stack_ffffffffffffd680);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1130 = (_Base_ptr)pVar6.first._M_node;
    local_1128 = pVar6.second;
    std::__cxx11::string::~string(local_1118);
    std::allocator<char>::~allocator(&local_1119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1168 = (_Base_ptr)pVar6.first._M_node;
    local_1160 = pVar6.second;
    std::__cxx11::string::~string(local_1150);
    std::allocator<char>::~allocator(&local_1151);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testStartWriteDeepTile"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testStartWriteDeepTile");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testStartWriteDeepTile(in_stack_ffffffffffffd680);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    std::__cxx11::string::~string(local_1188);
    std::allocator<char>::~allocator(&local_1189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_11d8 = (_Base_ptr)pVar6.first._M_node;
    local_11d0 = pVar6.second;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffee40);
    std::allocator<char>::~allocator(&local_11c1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testStartWriteUTF8"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testStartWriteUTF8");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testStartWriteUTF8(in_stack_ffffffffffffda40);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1210 = (_Base_ptr)pVar6.first._M_node;
    local_1208 = pVar6.second;
    std::__cxx11::string::~string(local_11f8);
    std::allocator<char>::~allocator(&local_11f9);
    in_stack_ffffffffffffda80 = (string *)local_1231;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1248 = (_Base_ptr)pVar6.first._M_node;
    local_1240 = pVar6.second;
    std::__cxx11::string::~string((string *)(local_1231 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1231);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testWriteScans"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testWriteScans");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testWriteScans(&local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1280 = (_Base_ptr)pVar6.first._M_node;
    local_1278 = pVar6.second;
    std::__cxx11::string::~string(local_1268);
    std::allocator<char>::~allocator(&local_1269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_12b8 = (_Base_ptr)pVar6.first._M_node;
    local_12b0 = pVar6.second;
    std::__cxx11::string::~string(local_12a0);
    std::allocator<char>::~allocator(&local_12a1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testWriteTiles"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testWriteTiles");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testWriteTiles(in_stack_ffffffffffffda80);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    in_stack_ffffffffffffda10 = pVar6.first._M_node;
    local_12e8 = pVar6.second;
    local_12f0 = in_stack_ffffffffffffda10._M_node;
    std::__cxx11::string::~string(local_12d8);
    std::allocator<char>::~allocator(&local_12d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1328 = (_Base_ptr)pVar6.first._M_node;
    local_1320 = pVar6.second;
    std::__cxx11::string::~string(local_1310);
    std::allocator<char>::~allocator(&local_1311);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testWriteMultiPart"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testWriteMultiPart");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testWriteMultiPart(in_stack_ffffffffffffd6e0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1360 = (_Base_ptr)pVar6.first._M_node;
    local_1358 = pVar6.second;
    std::__cxx11::string::~string(local_1348);
    std::allocator<char>::~allocator(&local_1349);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1398 = (_Base_ptr)pVar6.first._M_node;
    local_1390 = pVar6.second;
    std::__cxx11::string::~string(local_1380);
    std::allocator<char>::~allocator(&local_1381);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testWriteDeep"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_write"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testWriteDeep");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testWriteDeep(&local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_13d0 = (_Base_ptr)pVar6.first._M_node;
    local_13c8 = pVar6.second;
    std::__cxx11::string::~string(local_13b8);
    std::allocator<char>::~allocator(&local_13b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1408 = (_Base_ptr)pVar6.first._M_node;
    local_1400 = pVar6.second;
    std::__cxx11::string::~string(local_13f0);
    std::allocator<char>::~allocator(&local_13f1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testHUF"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testHUF");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testHUF((string *)in_stack_ffffffffffffda10._M_node);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1440 = (_Base_ptr)pVar6.first._M_node;
    local_1438 = pVar6.second;
    std::__cxx11::string::~string(local_1428);
    std::allocator<char>::~allocator(&local_1429);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1478 = (_Base_ptr)pVar6.first._M_node;
    local_1470 = pVar6.second;
    std::__cxx11::string::~string(local_1460);
    std::allocator<char>::~allocator(&local_1461);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testDWAQuantize"), iVar2 == 0))
       || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testDWAQuantize");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testDWAQuantize(in_stack_ffffffffffffd6d0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_14b0 = (_Base_ptr)pVar6.first._M_node;
    local_14a8 = pVar6.second;
    std::__cxx11::string::~string(local_1498);
    std::allocator<char>::~allocator(&local_1499);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_14e8 = (_Base_ptr)pVar6.first._M_node;
    local_14e0 = pVar6.second;
    std::__cxx11::string::~string(local_14d0);
    std::allocator<char>::~allocator(&local_14d1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testDWATable"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testDWATable");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testDWATable((string *)0x156d8d);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1520 = (_Base_ptr)pVar6.first._M_node;
    local_1518 = pVar6.second;
    std::__cxx11::string::~string(local_1508);
    std::allocator<char>::~allocator(&local_1509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1558 = (_Base_ptr)pVar6.first._M_node;
    local_1550 = pVar6.second;
    std::__cxx11::string::~string(local_1540);
    std::allocator<char>::~allocator(&local_1541);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testB44Table"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testB44Table");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testB44Table(in_stack_ffffffffffffd4b0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1590 = (_Base_ptr)pVar6.first._M_node;
    local_1588 = pVar6.second;
    std::__cxx11::string::~string(local_1578);
    std::allocator<char>::~allocator(&local_1579);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_15c8 = (_Base_ptr)pVar6.first._M_node;
    local_15c0 = pVar6.second;
    std::__cxx11::string::~string(local_15b0);
    std::allocator<char>::~allocator(&local_15b1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) || (iVar2 = strcmp(*(char **)(local_10 + 8),"testNoCompression"), iVar2 == 0)
        ) || (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testNoCompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testNoCompression((string *)0x15726b);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1600 = (_Base_ptr)pVar6.first._M_node;
    local_15f8 = pVar6.second;
    std::__cxx11::string::~string(local_15e8);
    std::allocator<char>::~allocator(&local_15e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1638 = (_Base_ptr)pVar6.first._M_node;
    local_1630 = pVar6.second;
    std::__cxx11::string::~string(local_1620);
    std::allocator<char>::~allocator(&local_1621);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testRLECompression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testRLECompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testRLECompression((string *)0x1574da);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1670 = (_Base_ptr)pVar6.first._M_node;
    local_1668 = pVar6.second;
    std::__cxx11::string::~string(local_1658);
    std::allocator<char>::~allocator(&local_1659);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_16a8 = (_Base_ptr)pVar6.first._M_node;
    local_16a0 = pVar6.second;
    std::__cxx11::string::~string(local_1690);
    std::allocator<char>::~allocator(&local_1691);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testZIPCompression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testZIPCompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testZIPCompression((string *)0x157749);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_16e0 = (_Base_ptr)pVar6.first._M_node;
    local_16d8 = pVar6.second;
    std::__cxx11::string::~string(local_16c8);
    std::allocator<char>::~allocator(&local_16c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1718 = (_Base_ptr)pVar6.first._M_node;
    local_1710 = pVar6.second;
    std::__cxx11::string::~string(local_1700);
    std::allocator<char>::~allocator(&local_1701);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testZIPSCompression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testZIPSCompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testZIPSCompression((string *)0x1579b8);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1750 = (_Base_ptr)pVar6.first._M_node;
    local_1748 = pVar6.second;
    std::__cxx11::string::~string(local_1738);
    std::allocator<char>::~allocator(&local_1739);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1788 = (_Base_ptr)pVar6.first._M_node;
    local_1780 = pVar6.second;
    std::__cxx11::string::~string(local_1770);
    std::allocator<char>::~allocator(&local_1771);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testPIZCompression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testPIZCompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testPIZCompression((string *)0x157c27);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_17c0 = (_Base_ptr)pVar6.first._M_node;
    local_17b8 = pVar6.second;
    std::__cxx11::string::~string(local_17a8);
    std::allocator<char>::~allocator(&local_17a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_17f8 = (_Base_ptr)pVar6.first._M_node;
    local_17f0 = pVar6.second;
    std::__cxx11::string::~string(local_17e0);
    std::allocator<char>::~allocator(&local_17e1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testPXR24Compression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testPXR24Compression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testPXR24Compression((string *)0x157e96);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1830 = (_Base_ptr)pVar6.first._M_node;
    local_1828 = pVar6.second;
    std::__cxx11::string::~string(local_1818);
    std::allocator<char>::~allocator(&local_1819);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1868 = (_Base_ptr)pVar6.first._M_node;
    local_1860 = pVar6.second;
    std::__cxx11::string::~string(local_1850);
    std::allocator<char>::~allocator(&local_1851);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testB44Compression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testB44Compression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testB44Compression((string *)0x158105);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_18a0 = (_Base_ptr)pVar6.first._M_node;
    local_1898 = pVar6.second;
    std::__cxx11::string::~string(local_1888);
    std::allocator<char>::~allocator(&local_1889);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_18d8 = (_Base_ptr)pVar6.first._M_node;
    local_18d0 = pVar6.second;
    std::__cxx11::string::~string(local_18c0);
    std::allocator<char>::~allocator(&local_18c1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testB44ACompression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testB44ACompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testB44ACompression((string *)0x158374);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1910 = (_Base_ptr)pVar6.first._M_node;
    local_1908 = pVar6.second;
    std::__cxx11::string::~string(local_18f8);
    std::allocator<char>::~allocator(&local_18f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1948 = (_Base_ptr)pVar6.first._M_node;
    local_1940 = pVar6.second;
    std::__cxx11::string::~string(local_1930);
    std::allocator<char>::~allocator(&local_1931);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testDWAACompression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testDWAACompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testDWAACompression((string *)0x1585e3);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1980 = (_Base_ptr)pVar6.first._M_node;
    local_1978 = pVar6.second;
    std::__cxx11::string::~string(local_1968);
    std::allocator<char>::~allocator(&local_1969);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_19b8 = (_Base_ptr)pVar6.first._M_node;
    local_19b0 = pVar6.second;
    std::__cxx11::string::~string(local_19a0);
    std::allocator<char>::~allocator(&local_19a1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testDWABCompression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testDWABCompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testDWABCompression((string *)0x158852);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_19f0 = (_Base_ptr)pVar6.first._M_node;
    local_19e8 = pVar6.second;
    std::__cxx11::string::~string(local_19d8);
    std::allocator<char>::~allocator(&local_19d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1a28 = (_Base_ptr)pVar6.first._M_node;
    local_1a20 = pVar6.second;
    std::__cxx11::string::~string(local_1a10);
    std::allocator<char>::~allocator(&local_1a11);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testDeepNoCompression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testDeepNoCompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testDeepNoCompression(&local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1a60 = (_Base_ptr)pVar6.first._M_node;
    local_1a58 = pVar6.second;
    std::__cxx11::string::~string(local_1a48);
    std::allocator<char>::~allocator(&local_1a49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1a98 = (_Base_ptr)pVar6.first._M_node;
    local_1a90 = pVar6.second;
    std::__cxx11::string::~string(local_1a80);
    std::allocator<char>::~allocator(&local_1a81);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testDeepZIPCompression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testDeepZIPCompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testDeepZIPCompression(&local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1ad0 = (_Base_ptr)pVar6.first._M_node;
    local_1ac8 = pVar6.second;
    std::__cxx11::string::~string(local_1ab8);
    std::allocator<char>::~allocator(&local_1ab9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1b08 = (_Base_ptr)pVar6.first._M_node;
    local_1b00 = pVar6.second;
    std::__cxx11::string::~string(local_1af0);
    std::allocator<char>::~allocator(&local_1af1);
  }
  if ((local_31 & 1) == 0) {
    if (((local_8 < 2) ||
        (iVar2 = strcmp(*(char **)(local_10 + 8),"testDeepZIPSCompression"), iVar2 == 0)) ||
       (iVar2 = strcmp(*(char **)(local_10 + 8),"core_compression"), iVar2 == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\n=======\nRunning ");
      poVar3 = std::operator<<(poVar3,"testDeepZIPSCompression");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      testDeepZIPSCompression(&local_30);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1b40 = (_Base_ptr)pVar6.first._M_node;
    local_1b38 = pVar6.second;
    std::__cxx11::string::~string(local_1b28);
    std::allocator<char>::~allocator(&local_1b29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8);
    local_1b78 = (_Base_ptr)pVar6.first._M_node;
    local_1b70 = pVar6.second;
    std::__cxx11::string::~string(local_1b60);
    std::allocator<char>::~allocator(&local_1b61);
  }
  if ((local_31 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"removing temp dir ");
    poVar3 = std::operator<<(poVar3,(string *)&local_30);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __path = (char *)std::__cxx11::string::c_str();
    iVar2 = rmdir(__path);
    if (iVar2 != 0) {
      piVar5 = __errno_location();
      if (*piVar5 == 0x27) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Temp dir ");
        poVar3 = std::operator<<(poVar3,(string *)&local_30);
        poVar3 = std::operator<<(poVar3," not empty");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error removing dir ");
        poVar3 = std::operator<<(poVar3,(string *)&local_30);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      local_4 = 1;
      goto LAB_0015940b;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "OpenEXR Core Test runs a series of tests to confirm\ncorrect behavior of the core low-level OpenEXR library.\nIf all is correct, OpenEXRCoreTest will complete without\ncrashing or leaking memory.\n"
                   );
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,
                    "If a test fails, an individual test can be re-run, avoiding\nthe wait for previous tests to complete. This allows easier debugging\nof the failure.\n"
                   );
    std::operator<<((ostream *)&std::cout,"\n");
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "A \'suite\' of tests can also be run, to allow a subset of\n");
    poVar3 = std::operator<<(poVar3,"tests to run. This is useful as an initial confirmation\n");
    poVar3 = std::operator<<(poVar3,
                             "that a modification to the library has not introduced an error.\n");
    std::operator<<(poVar3,"Suites can be run in parallel for speed. Every test is in one suite.\n")
    ;
    std::operator<<((ostream *)&std::cout,"\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"usage:\n");
    poVar3 = std::operator<<(poVar3,"OpenEXRCoreTest           : with no arguments, run all tests\n"
                            );
    poVar3 = std::operator<<(poVar3,
                             "OpenEXRCoreTest TEST      : run only specific test, then quit\n");
    std::operator<<(poVar3,"OpenEXRCoreTest SUITE     : run all the tests in the given SUITE\n");
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"available TESTs:\n");
    local_1b80._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_ffffffffffffd488);
    while( true ) {
      local_1b88._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(in_stack_ffffffffffffd488);
      bVar1 = std::operator!=(&local_1b80,&local_1b88);
      if (!bVar1) break;
      poVar3 = std::operator<<((ostream *)&std::cout,' ');
      pbVar4 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x15917c);
      poVar3 = std::operator<<(poVar3,(string *)pbVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffd490);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"available SUITEs:\n");
    local_1b90._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_ffffffffffffd488);
    while( true ) {
      local_1b98._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(in_stack_ffffffffffffd488);
      bVar1 = std::operator!=(&local_1b90,&local_1b98);
      if (!bVar1) break;
      poVar3 = std::operator<<((ostream *)&std::cout,' ');
      pbVar4 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x15924b);
      poVar3 = std::operator<<(poVar3,(string *)pbVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffd490);
    }
  }
  local_4 = 0;
LAB_0015940b:
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x159418);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x159425);
  std::__cxx11::string::~string((string *)&local_30);
  return local_4;
}

Assistant:

int
main (int argc, char* argv[])
{
    // Create temporary files in a uniquely named private temporary
    // subdirectory of IMF_TMP_DIR to avoid colliding with other
    // running instances of this program.

    std::string tempDir;

    bool helpMode = false;
    if (argc == 2 &&
        (strcmp (argv[1], "--help") == 0 || strcmp (argv[1], "-h") == 0))
    {
        helpMode = true;
    }
    std::set<std::string> tests;
    std::set<std::string> suites;

    if (!helpMode) { tempDir = makeTempDir (); }

    TEST (testBase, "core");
    TEST (testBaseErrors, "core");
    TEST (testBaseLimits, "core");
    TEST (testBaseDebug, "core");
    TEST (testCPUIdent, "core");
    TEST (testHalf, "core");
    TEST (testXDR, "core");
    TEST (testBufferCompression, "core");
    TEST (testTempContext, "core");

    TEST (testAttrSizes, "gen_attr");
    TEST (testAttrStrings, "gen_attr");
    TEST (testAttrStringVectors, "gen_attr");
    TEST (testAttrFloatVectors, "gen_attr");
    TEST (testAttrChlists, "gen_attr");
    TEST (testAttrPreview, "gen_attr");
    TEST (testAttrOpaque, "gen_attr");
    TEST (testAttrHandler, "gen_attr");
    TEST (testAttrLists, "gen_attr");

    TEST (testReadBadArgs, "core_read");
    TEST (testReadBadFiles, "core_read");
    TEST (testReadMeta, "core_read");
    TEST (testOpenScans, "core_read");
    TEST (testOpenTiles, "core_read");
    TEST (testOpenMultiPart, "core_read");
    TEST (testOpenDeep, "core_read");
    TEST (testReadScans, "core_read");
    TEST (testReadTiles, "core_read");
    TEST (testReadMultiPart, "core_read");
    TEST (testReadDeep, "core_read");
    TEST (testReadUnpack, "core_read");

    TEST (testWriteBadArgs, "core_write");
    TEST (testWriteBadFiles, "core_write");
    TEST (testUpdateMeta, "core_write");
    TEST (testWriteBaseHeader, "core_write");
    TEST (testWriteAttrs, "core_write");
    TEST (testStartWriteScan, "core_write");
    TEST (testStartWriteTile, "core_write");
    TEST (testStartWriteDeepScan, "core_write");
    TEST (testStartWriteDeepTile, "core_write");
    TEST (testStartWriteUTF8, "core_write");
    TEST (testWriteScans, "core_write");
    TEST (testWriteTiles, "core_write");
    TEST (testWriteMultiPart, "core_write");
    TEST (testWriteDeep, "core_write");

    TEST (testHUF, "core_compression");
    TEST (testDWAQuantize, "core_compression");
    TEST (testDWATable, "core_compression");
    TEST (testB44Table, "core_compression");
    TEST (testNoCompression, "core_compression");
    TEST (testRLECompression, "core_compression");
    TEST (testZIPCompression, "core_compression");
    TEST (testZIPSCompression, "core_compression");
    TEST (testPIZCompression, "core_compression");
    TEST (testPXR24Compression, "core_compression");
    TEST (testB44Compression, "core_compression");
    TEST (testB44ACompression, "core_compression");
    TEST (testDWAACompression, "core_compression");
    TEST (testDWABCompression, "core_compression");

    TEST (testDeepNoCompression, "core_compression");
    TEST (testDeepZIPCompression, "core_compression");
    TEST (testDeepZIPSCompression, "core_compression");

    if (helpMode)
    {
        std::cout
            << "OpenEXR Core Test runs a series of tests to confirm\n"
               "correct behavior of the core low-level OpenEXR library.\n"
               "If all is correct, OpenEXRCoreTest will complete without\n"
               "crashing or leaking memory.\n";
        std::cout << "\n";
        std::cout
            << "If a test fails, an individual test can be re-run, avoiding\n"
               "the wait for previous tests to complete. This allows easier debugging\n"
               "of the failure.\n";
        std::cout << "\n";
        std::cout
            << "A 'suite' of tests can also be run, to allow a subset of\n"
            << "tests to run. This is useful as an initial confirmation\n"
            << "that a modification to the library has not introduced an error.\n"
            << "Suites can be run in parallel for speed. Every test is in one suite.\n";
        std::cout << "\n";
        std::cout
            << "usage:\n"
            << "OpenEXRCoreTest           : with no arguments, run all tests\n"
            << "OpenEXRCoreTest TEST      : run only specific test, then quit\n"
            << "OpenEXRCoreTest SUITE     : run all the tests in the given SUITE\n";
        std::cout << "\n";
        std::cout << "available TESTs:\n";
        for (auto i = tests.begin (); i != tests.end (); ++i)
        {
            std::cout << ' ' << *i << std::endl;
        }
        std::cout << "\n";
        std::cout << "available SUITEs:\n";
        for (auto i = suites.begin (); i != suites.end (); ++i)
        {
            std::cout << ' ' << *i << std::endl;
        }
    }
    else
    {
        std::cout << "removing temp dir " << tempDir << std::endl;
        int rv = rmdir (tempDir.c_str ());
        if (rv != 0)
        {
            if (errno == ENOTEMPTY)
                std::cerr << "Temp dir " << tempDir << " not empty"
                          << std::endl;
            else
                std::cerr << "Error removing dir " << tempDir << ": " << rv
                          << std::endl;
            return 1;
        }

#ifdef OPENEXR_IMF_HAVE_LINUX_PROCFS

        //
        // Allow the user to check for file descriptor leaks
        //

        std::cout << "open file descriptors:" << std::endl;

        std::stringstream ss;
        ss << "ls -lG /proc/" << getpid () << "/fd";

        if (system (ss.str ().c_str ()) == -1)
        {
            std::cout << "failed to run ls\n";
        }

        std::cout << endl;

#endif
    }
    return 0;
}